

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_refit.cpp
# Opt level: O1

BBox3fa * __thiscall
embree::sse2::BVHNRefitter<4>::refit_toplevel
          (BBox3fa *__return_storage_ptr__,BVHNRefitter<4> *this,NodeRef *ref,size_t *subtrees,
          BBox3fa *subTreeBounds,size_t depth)

{
  size_t sVar1;
  ulong uVar2;
  undefined8 uVar3;
  AABBNode *node;
  long lVar4;
  undefined1 auVar5 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined1 auVar7 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  undefined1 auVar9 [16];
  BBox3fa bounds [4];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_d8;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  if (depth < 4) {
    uVar2 = ref->ptr;
    if ((uVar2 & 0xf) == 0) {
      lVar4 = 0;
      do {
        if (*(long *)(uVar2 + lVar4) == 8) {
          *(undefined8 *)(local_b8 + lVar4 * 4) = 0x7f8000007f800000;
          *(undefined8 *)(local_b8 + lVar4 * 4 + 8) = 0x7f8000007f800000;
          *(undefined8 *)(local_a8 + lVar4 * 4) = 0xff800000ff800000;
          *(undefined8 *)(local_a8 + lVar4 * 4 + 8) = 0xff800000ff800000;
        }
        else {
          refit_toplevel((BBox3fa *)&local_d8.field_1,this,(NodeRef *)(uVar2 + lVar4),subtrees,
                         subTreeBounds,depth + 1);
          *(undefined8 *)(local_b8 + lVar4 * 4) = local_d8._0_8_;
          *(undefined8 *)(local_b8 + lVar4 * 4 + 8) = local_d8._8_8_;
          *(undefined8 *)(local_a8 + lVar4 * 4) = local_c8;
          *(undefined8 *)(local_a8 + lVar4 * 4 + 8) = uStack_c0;
        }
        lVar4 = lVar4 + 8;
      } while (lVar4 != 0x20);
      auVar5 = minps(local_b8,local_98);
      auVar7 = maxps(local_a8,local_88);
      *(int *)(uVar2 + 0x20) = local_b8._0_4_;
      *(int *)(uVar2 + 0x24) = local_98._0_4_;
      *(int *)(uVar2 + 0x28) = local_78._0_4_;
      *(int *)(uVar2 + 0x2c) = local_58._0_4_;
      *(int *)(uVar2 + 0x40) = local_b8._4_4_;
      *(int *)(uVar2 + 0x44) = local_98._4_4_;
      *(int *)(uVar2 + 0x48) = local_78._4_4_;
      *(int *)(uVar2 + 0x4c) = local_58._4_4_;
      *(int *)(uVar2 + 0x60) = local_b8._8_4_;
      *(int *)(uVar2 + 100) = local_98._8_4_;
      *(int *)(uVar2 + 0x68) = local_78._8_4_;
      *(int *)(uVar2 + 0x6c) = local_58._8_4_;
      *(int *)(uVar2 + 0x30) = local_a8._0_4_;
      *(int *)(uVar2 + 0x34) = local_88._0_4_;
      *(int *)(uVar2 + 0x38) = local_68._0_4_;
      *(int *)(uVar2 + 0x3c) = local_48._0_4_;
      *(int *)(uVar2 + 0x50) = local_a8._4_4_;
      *(int *)(uVar2 + 0x54) = local_88._4_4_;
      *(int *)(uVar2 + 0x58) = local_68._4_4_;
      *(int *)(uVar2 + 0x5c) = local_48._4_4_;
      *(int *)(uVar2 + 0x70) = local_a8._8_4_;
      *(int *)(uVar2 + 0x74) = local_88._8_4_;
      *(int *)(uVar2 + 0x78) = local_68._8_4_;
      *(int *)(uVar2 + 0x7c) = local_48._8_4_;
      auVar9 = minps(local_78,local_58);
      aVar6 = (anon_union_16_2_47237d3f_for_Vec3fa_0)minps(auVar5,auVar9);
      auVar5 = maxps(local_68,local_48);
      aVar8 = (anon_union_16_2_47237d3f_for_Vec3fa_0)maxps(auVar7,auVar5);
      (__return_storage_ptr__->lower).field_0 = aVar6;
      (__return_storage_ptr__->upper).field_0 = aVar8;
    }
    else {
      (**this->leafBounds->_vptr_LeafBoundsInterface)(__return_storage_ptr__);
    }
  }
  else {
    sVar1 = *subtrees;
    *subtrees = sVar1 + 1;
    uVar3 = *(undefined8 *)((long)&subTreeBounds[sVar1].lower.field_0 + 8);
    *(undefined8 *)&(__return_storage_ptr__->lower).field_0 =
         *(undefined8 *)&subTreeBounds[sVar1].lower.field_0;
    *(undefined8 *)((long)&(__return_storage_ptr__->lower).field_0 + 8) = uVar3;
    uVar3 = *(undefined8 *)((long)&subTreeBounds[sVar1].upper.field_0 + 8);
    *(undefined8 *)&(__return_storage_ptr__->upper).field_0 =
         *(undefined8 *)&subTreeBounds[sVar1].upper.field_0;
    *(undefined8 *)((long)&(__return_storage_ptr__->upper).field_0 + 8) = uVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

BBox3fa BVHNRefitter<N>::refit_toplevel(NodeRef& ref,
                                            size_t &subtrees,
                                            const BBox3fa *const subTreeBounds,
                                            const size_t depth)
    {
      if (depth >= MAX_SUB_TREE_EXTRACTION_DEPTH) 
      {
        assert(subtrees < MAX_NUM_SUB_TREES);
        assert(subTrees[subtrees] == ref);
        return subTreeBounds[subtrees++];
      }

      if (ref.isAABBNode())
      {
        AABBNode* node = ref.getAABBNode();
        BBox3fa bounds[N];

        for (size_t i=0; i<N; i++)
        {
          NodeRef& child = node->child(i);

          if (unlikely(child == BVH::emptyNode)) 
            bounds[i] = BBox3fa(empty);
          else
            bounds[i] = refit_toplevel(child,subtrees,subTreeBounds,depth+1); 
        }
        
        BBox3vf<N> boundsT = transpose<N>(bounds);
      
        /* set new bounds */
        node->lower_x = boundsT.lower.x;
        node->lower_y = boundsT.lower.y;
        node->lower_z = boundsT.lower.z;
        node->upper_x = boundsT.upper.x;
        node->upper_y = boundsT.upper.y;
        node->upper_z = boundsT.upper.z;
        
        return merge<N>(bounds);
      }
      else
        return leafBounds.leafBounds(ref);
    }